

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComments.cpp
# Opt level: O0

void __thiscall
RemoveCommentsTest_testSingleLineComments_Test::RemoveCommentsTest_testSingleLineComments_Test
          (RemoveCommentsTest_testSingleLineComments_Test *this)

{
  RemoveCommentsTest_testSingleLineComments_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__RemoveCommentsTest_testSingleLineComments_Test_0103ed58;
  return;
}

Assistant:

TEST(RemoveCommentsTest, testSingleLineComments)
{
    const char* szTest = "int i = 0; \n"
        "if (4 == //)\n"
        "\ttrue) { // do something here \n"
        "\t// hello ... and bye //\n";

    const size_t len( ::strlen( szTest ) + 1 );
    char* szTest2 = new char[ len ];
    ::strncpy( szTest2, szTest, len );

    const char* szTestResult = "int i = 0; \n"
        "if (4 ==    \n"
        "\ttrue) {                      \n"
        "\t                       \n";

    CommentRemover::RemoveLineComments("//",szTest2,' ');
    EXPECT_STREQ(szTestResult, szTest2);

    delete[] szTest2;
}